

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBQuantize(uint8_t *dst_argb,int dst_stride_argb,int scale,int interval_size,
                int interval_offset,int dst_x,int dst_y,int width,int height)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  bool bVar7;
  
  iVar4 = -1;
  if ((((0xffffff00 < interval_size - 0x100U) && (-1 < (dst_y | dst_x))) &&
      (dst_argb != (uint8_t *)0x0)) && ((0 < width && (0 < height)))) {
    bVar7 = width * 4 != dst_stride_argb;
    iVar4 = 0;
    if (bVar7) {
      iVar4 = dst_stride_argb;
    }
    iVar5 = 1;
    if (!bVar7) {
      iVar5 = height;
    }
    if (!bVar7) {
      height = 1;
    }
    iVar1 = libyuv::TestCpuFlag(0x20);
    pcVar2 = ARGBQuantizeRow_C;
    if ((iVar5 * width & 3U) == 0) {
      pcVar2 = ARGBQuantizeRow_SSE2;
    }
    puVar6 = dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2);
    pcVar3 = ARGBQuantizeRow_C;
    if (iVar1 != 0) {
      pcVar3 = pcVar2;
    }
    while (bVar7 = height != 0, height = height + -1, bVar7) {
      (*pcVar3)(puVar6,scale,interval_size,interval_offset,iVar5 * width);
      puVar6 = puVar6 + iVar4;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

LIBYUV_API
int ARGBQuantize(uint8_t* dst_argb,
                 int dst_stride_argb,
                 int scale,
                 int interval_size,
                 int interval_offset,
                 int dst_x,
                 int dst_y,
                 int width,
                 int height) {
  int y;
  void (*ARGBQuantizeRow)(uint8_t * dst_argb, int scale, int interval_size,
                          int interval_offset, int width) = ARGBQuantizeRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || width <= 0 || height <= 0 || dst_x < 0 || dst_y < 0 ||
      interval_size < 1 || interval_size > 255) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_ARGBQUANTIZEROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(width, 4)) {
    ARGBQuantizeRow = ARGBQuantizeRow_SSE2;
  }
#endif
#if defined(HAS_ARGBQUANTIZEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBQuantizeRow = ARGBQuantizeRow_NEON;
  }
#endif
#if defined(HAS_ARGBQUANTIZEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBQuantizeRow = ARGBQuantizeRow_MSA;
  }
#endif
  for (y = 0; y < height; ++y) {
    ARGBQuantizeRow(dst, scale, interval_size, interval_offset, width);
    dst += dst_stride_argb;
  }
  return 0;
}